

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.hpp
# Opt level: O0

void __thiscall cppjit::builder::builder::read_and_print_log(builder *this,string *path)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  ostream *this_00;
  string local_250 [8];
  string line;
  istream local_220 [8];
  ifstream f;
  string *path_local;
  builder *this_local;
  
  std::ifstream::ifstream(local_220);
  std::ifstream::open(local_220,path,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator<<((ostream *)&std::cerr,"could not read log file");
  }
  else {
    std::__cxx11::string::string(local_250);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_250);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      this_00 = std::operator<<((ostream *)&std::cerr,local_250);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    std::ifstream::close();
    std::__cxx11::string::~string(local_250);
  }
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void read_and_print_log(std::string path) {
    std::ifstream f;
    f.open(path);
    if (!f.is_open()) {
      std::cerr << "could not read log file";
      return;
    }
    std::string line;
    while (std::getline(f, line)) {
      std::cerr << line << std::endl;
    }
    f.close();
  }